

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void printfmt<int,unsigned_long>(ostream *out,char *format,int *arg,unsigned_long *args)

{
  char *pcStack_30;
  uchar ch;
  char *s;
  unsigned_long *args_local;
  int *arg_local;
  char *format_local;
  ostream *out_local;
  
  pcStack_30 = format;
  while( true ) {
    if (*pcStack_30 == '\0') {
      return;
    }
    if ((*pcStack_30 == '{') && (pcStack_30[1] == '}')) break;
    std::operator<<(out,*pcStack_30);
    pcStack_30 = pcStack_30 + 1;
  }
  print<int>(out,arg);
  printfmt<unsigned_long>(out,pcStack_30 + 2,args);
  return;
}

Assistant:

inline void printfmt(std::ostream& out, const char *format, const T& arg, const Args&... args) {
    char* s = const_cast<char*>(format);
    for (unsigned char ch; (ch = *s) != '\0'; out << *s++) {
        if (ch == '{' && *(s+1) == '}') {
            print(out, arg);
            printfmt(out, s+2, args...);
            break;
        }
    }
}